

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CupdlpWrapper.cpp
# Opt level: O0

cupdlp_int getCupdlpLogLevel(HighsOptions *options)

{
  HighsOptions *options_local;
  cupdlp_int local_4;
  
  if (((options->super_HighsOptionsStruct).output_flag & 1U) == 0) {
    local_4 = 0;
  }
  else if ((options->super_HighsOptionsStruct).log_dev_level == 0) {
    local_4 = 1;
  }
  else {
    local_4 = 2;
  }
  return local_4;
}

Assistant:

cupdlp_int getCupdlpLogLevel(const HighsOptions& options) {
  if (options.output_flag) {
    if (options.log_dev_level) {
      return 2;
    } else {
      return 1;
    }
  }
  return 0;
}